

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O1

wchar_t header_Solaris_ACL(archive_read *a,tar *tar,archive_entry *entry,void *h,size_t *unconsumed)

{
  wchar_t wVar1;
  int64_t iVar2;
  archive_string_conv *paVar3;
  archive_acl *acl;
  int *piVar4;
  long lVar5;
  long lVar6;
  char *pcVar7;
  char cVar8;
  uint uVar9;
  int error_number;
  char *pcVar10;
  size_t *unconsumed_00;
  
  unconsumed_00 = unconsumed;
  iVar2 = tar_atol((char *)((long)h + 0x7c),0xc);
  wVar1 = read_body_to_string(a,tar,(archive_string *)h,unconsumed,unconsumed_00);
  if (wVar1 != L'\0') {
    return wVar1;
  }
  wVar1 = tar_read_header(a,tar,entry,unconsumed);
  if ((wVar1 != L'\0') && (wVar1 != L'\xffffffec')) {
    return wVar1;
  }
  pcVar10 = (tar->acl_text).s;
  pcVar7 = pcVar10 + iVar2;
  cVar8 = *pcVar10;
  lVar5 = 0;
  if (0 < iVar2 && cVar8 != '\0') {
    lVar5 = 0;
    do {
      pcVar10 = pcVar10 + 1;
      if ((byte)(cVar8 - 0x38U) < 0xf8) {
        pcVar7 = "Malformed Solaris ACL attribute (invalid digit)";
        goto LAB_00499207;
      }
      lVar5 = (ulong)(byte)(cVar8 - 0x30) + lVar5 * 8;
      if (0xffffff < lVar5) {
        pcVar7 = "Malformed Solaris ACL attribute (count too large)";
        goto LAB_00499207;
      }
      cVar8 = *pcVar10;
    } while ((cVar8 != '\0') && (pcVar10 < pcVar7));
  }
  uVar9 = (uint)lVar5 & 0xfffc0000;
  if (uVar9 == 0x40000) {
    wVar1 = L'Ā';
  }
  else {
    if (uVar9 != 0xc0000) {
      archive_set_error(&a->archive,-1,"Malformed Solaris ACL attribute (unsupported type %o)");
      return L'\xffffffec';
    }
    wVar1 = L'㰀';
  }
  if (pcVar7 <= pcVar10 + 1) {
    pcVar7 = "Malformed Solaris ACL attribute (body overflow)";
LAB_00499207:
    archive_set_error(&a->archive,-1,pcVar7);
    return L'\xffffffec';
  }
  lVar5 = 1;
  do {
    lVar6 = lVar5;
    if (pcVar10[lVar6] == '\0') break;
    lVar5 = lVar6 + 1;
  } while (pcVar10 + lVar6 < pcVar7);
  if (tar->sconv_acl == (archive_string_conv *)0x0) {
    paVar3 = archive_string_conversion_from_charset(&a->archive,"UTF-8",L'\x01');
    tar->sconv_acl = paVar3;
    if (paVar3 == (archive_string_conv *)0x0) {
      return L'\xffffffe2';
    }
  }
  (tar->localname).length = 0;
  archive_strncat(&tar->localname,pcVar10 + 1,lVar6 - 1);
  acl = archive_entry_acl(entry);
  wVar1 = archive_acl_from_text_l(acl,(tar->localname).s,wVar1,tar->sconv_acl);
  if (wVar1 != L'\0') {
    piVar4 = __errno_location();
    if (*piVar4 == 0xc) {
      pcVar7 = "Can\'t allocate memory for ACL";
      error_number = 0xc;
    }
    else {
      pcVar7 = "Malformed Solaris ACL attribute (unparsable)";
      error_number = -1;
    }
    archive_set_error(&a->archive,error_number,pcVar7);
    return wVar1;
  }
  return L'\0';
}

Assistant:

static int
header_Solaris_ACL(struct archive_read *a, struct tar *tar,
    struct archive_entry *entry, const void *h, size_t *unconsumed)
{
	const struct archive_entry_header_ustar *header;
	size_t size;
	int err, acl_type;
	int64_t type;
	char *acl, *p;

	/*
	 * read_body_to_string adds a NUL terminator, but we need a little
	 * more to make sure that we don't overrun acl_text later.
	 */
	header = (const struct archive_entry_header_ustar *)h;
	size = (size_t)tar_atol(header->size, sizeof(header->size));
	err = read_body_to_string(a, tar, &(tar->acl_text), h, unconsumed);
	if (err != ARCHIVE_OK)
		return (err);

	/* Recursively read next header */
	err = tar_read_header(a, tar, entry, unconsumed);
	if ((err != ARCHIVE_OK) && (err != ARCHIVE_WARN))
		return (err);

	/* TODO: Examine the first characters to see if this
	 * is an AIX ACL descriptor.  We'll likely never support
	 * them, but it would be polite to recognize and warn when
	 * we do see them. */

	/* Leading octal number indicates ACL type and number of entries. */
	p = acl = tar->acl_text.s;
	type = 0;
	while (*p != '\0' && p < acl + size) {
		if (*p < '0' || *p > '7') {
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "Malformed Solaris ACL attribute (invalid digit)");
			return(ARCHIVE_WARN);
		}
		type <<= 3;
		type += *p - '0';
		if (type > 077777777) {
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "Malformed Solaris ACL attribute (count too large)");
			return (ARCHIVE_WARN);
		}
		p++;
	}
	switch ((int)type & ~0777777) {
	case 01000000:
		/* POSIX.1e ACL */
		acl_type = ARCHIVE_ENTRY_ACL_TYPE_ACCESS;
		break;
	case 03000000:
		/* NFSv4 ACL */
		acl_type = ARCHIVE_ENTRY_ACL_TYPE_NFS4;
		break;
	default:
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "Malformed Solaris ACL attribute (unsupported type %o)",
		    (int)type);
		return (ARCHIVE_WARN);
	}
	p++;

	if (p >= acl + size) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "Malformed Solaris ACL attribute (body overflow)");
		return(ARCHIVE_WARN);
	}

	/* ACL text is null-terminated; find the end. */
	size -= (p - acl);
	acl = p;

	while (*p != '\0' && p < acl + size)
		p++;

	if (tar->sconv_acl == NULL) {
		tar->sconv_acl = archive_string_conversion_from_charset(
		    &(a->archive), "UTF-8", 1);
		if (tar->sconv_acl == NULL)
			return (ARCHIVE_FATAL);
	}
	archive_strncpy(&(tar->localname), acl, p - acl);
	err = archive_acl_from_text_l(archive_entry_acl(entry),
	    tar->localname.s, acl_type, tar->sconv_acl);
	if (err != ARCHIVE_OK) {
		if (errno == ENOMEM) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory for ACL");
		} else
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "Malformed Solaris ACL attribute (unparsable)");
	}
	return (err);
}